

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O2

ResponseLine * __thiscall
DebugInfoGenericCommand::trigger(DebugInfoGenericCommand *this,string_view parameters)

{
  User *pUVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  uint uVar5;
  ResponseLine *pRVar6;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> pbVar7;
  ResponseLine *pRVar8;
  ResponseLine *pRVar9;
  undefined8 uVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  long *plVar15;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  char local_159;
  long local_158;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  long *local_130;
  User *local_128;
  long *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50;
  
  if ((IRCCommand::selected_server == 0) && (IRCCommand::active_server == 0)) {
    pRVar6 = (ResponseLine *)operator_new(0x30);
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (pRVar6,0x2b,"Error: No IRC server is currently selected.",2);
  }
  else {
    pRVar6 = (ResponseLine *)operator_new(0x30);
    local_140 = (basic_string_view<char,_std::char_traits<char>_>)
                Jupiter::IRC::Client::getPrefixes();
    s_abi_cxx11_(&local_f0,"Prefixes: ",10);
    pbVar7 = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                       ((string *)&local_f0,&local_140);
    std::__cxx11::string::string(local_90,pbVar7);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar6,local_90,0);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)&local_f0);
    pRVar8 = (ResponseLine *)operator_new(0x30);
    bVar16 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::IRC::Client::getPrefixModes();
    local_140 = bVar16;
    s_abi_cxx11_(&local_f0,"Prefix Modes: ",0xe);
    pbVar7 = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                       ((string *)&local_f0,&local_140);
    std::__cxx11::string::string(local_b0,pbVar7);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar8,local_b0,0);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
    *(ResponseLine **)(pRVar6 + 0x28) = pRVar8;
    pRVar9 = (ResponseLine *)operator_new(0x30);
    uVar10 = Jupiter::IRC::Client::getChannelCount();
    string_printf_abi_cxx11_(&local_d0,"Outputting data for %u channels...",uVar10);
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar9,&local_d0,0);
    *(ResponseLine **)(pRVar8 + 0x28) = pRVar9;
    std::__cxx11::string::~string((string *)&local_d0);
    local_158 = *(long *)(pRVar8 + 0x28);
    lVar11 = Jupiter::IRC::Client::getChannels_abi_cxx11_();
    local_130 = (long *)(lVar11 + 0x10);
    while (local_130 = (long *)*local_130, local_130 != (long *)0x0) {
      pUVar1 = (User *)(local_130 + 5);
      pRVar8 = (ResponseLine *)operator_new(0x30);
      uVar10 = Jupiter::IRC::Client::Channel::getName();
      Jupiter::IRC::Client::Channel::getName();
      uVar5 = Jupiter::IRC::Client::Channel::getType();
      string_printf_abi_cxx11_(&local_50,"Channel %.*s - Type: %d",uVar10,extraout_RDX,(ulong)uVar5)
      ;
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar8,&local_50,0);
      *(ResponseLine **)(local_158 + 0x28) = pRVar8;
      std::__cxx11::string::~string((string *)&local_50);
      local_158 = *(long *)(local_158 + 0x28);
      lVar11 = Jupiter::IRC::Client::Channel::getUsers_abi_cxx11_();
      plVar15 = (long *)(lVar11 + 0x10);
      local_128 = pUVar1;
      while (pUVar1 = local_128, plVar15 = (long *)*plVar15, plVar15 != (long *)0x0) {
        Jupiter::IRC::Client::Channel::User::getUser();
        pRVar8 = (ResponseLine *)operator_new(0x30);
        lVar11 = Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
        uVar10 = *(undefined8 *)(lVar11 + 8);
        puVar12 = (undefined8 *)Jupiter::IRC::Client::User::getNickname_abi_cxx11_();
        uVar2 = *puVar12;
        lVar11 = Jupiter::IRC::Client::User::getUsername_abi_cxx11_();
        uVar3 = *(undefined8 *)(lVar11 + 8);
        puVar12 = (undefined8 *)Jupiter::IRC::Client::User::getUsername_abi_cxx11_();
        local_f8 = *puVar12;
        lVar11 = Jupiter::IRC::Client::User::getHostname_abi_cxx11_();
        local_100 = *(undefined8 *)(lVar11 + 8);
        puVar12 = (undefined8 *)Jupiter::IRC::Client::User::getHostname_abi_cxx11_();
        local_108 = *puVar12;
        cVar4 = Jupiter::IRC::Client::Channel::getUserPrefix(pUVar1);
        if (cVar4 == '\0') {
          local_159 = ' ';
        }
        else {
          local_159 = Jupiter::IRC::Client::Channel::getUserPrefix(pUVar1);
        }
        lVar11 = Jupiter::IRC::Client::Channel::User::getPrefixes_abi_cxx11_();
        local_110 = *(undefined8 *)(lVar11 + 8);
        puVar12 = (undefined8 *)Jupiter::IRC::Client::Channel::User::getPrefixes_abi_cxx11_();
        local_118 = *puVar12;
        local_120 = plVar15;
        uVar13 = Jupiter::IRC::Client::Channel::getName();
        Jupiter::IRC::Client::Channel::getName();
        uVar14 = Jupiter::IRC::Client::User::getChannelCount();
        string_printf_abi_cxx11_
                  (&local_70,
                   "User %.*s!%.*s@%.*s (prefix: %c; prefixes: %.*s) of channel %.*s (of %u shared)"
                   ,uVar10,uVar2,uVar3,local_f8,local_100,local_108,(ulong)(uint)(int)local_159,
                   local_110,local_118,uVar13,extraout_RDX_00,uVar14);
        Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar8,&local_70,0);
        *(ResponseLine **)(local_158 + 0x28) = pRVar8;
        std::__cxx11::string::~string((string *)&local_70);
        local_158 = *(long *)(local_158 + 0x28);
        plVar15 = local_120;
      }
    }
  }
  return pRVar6;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *DebugInfoGenericCommand::trigger(std::string_view parameters)
{
	IRC_Bot *server;
	if (IRCCommand::selected_server != nullptr)
		server = IRCCommand::selected_server;
	else if (IRCCommand::active_server != nullptr)
		server = IRCCommand::active_server;
	else
		return new Jupiter::GenericCommand::ResponseLine("Error: No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicError);

	Jupiter::GenericCommand::ResponseLine *ret = new Jupiter::GenericCommand::ResponseLine("Prefixes: "s += server->getPrefixes(), GenericCommand::DisplayType::PublicSuccess);
	Jupiter::GenericCommand::ResponseLine *line = new Jupiter::GenericCommand::ResponseLine("Prefix Modes: "s += server->getPrefixModes(), GenericCommand::DisplayType::PublicSuccess);
	ret->next = line;
	line->next = new Jupiter::GenericCommand::ResponseLine(string_printf("Outputting data for %u channels...", server->getChannelCount()), GenericCommand::DisplayType::PublicSuccess);
	line = line->next;

	for (auto& channel_pair : server->getChannels()) {
		auto& channel = channel_pair.second;
		line->next = new Jupiter::GenericCommand::ResponseLine(string_printf("Channel %.*s - Type: %d", channel.getName().size(),
			channel.getName().data(), channel.getType()), GenericCommand::DisplayType::PublicSuccess);
		line = line->next;

		for (auto& user_pair : channel.getUsers()) {
			Jupiter::IRC::Client::User *user = user_pair.second->getUser();
			line->next = new Jupiter::GenericCommand::ResponseLine(string_printf("User %.*s!%.*s@%.*s (prefix: %c; prefixes: %.*s) of channel %.*s (of %u shared)",
				user->getNickname().size(), user->getNickname().data(),
				user->getUsername().size(), user->getUsername().data(),
				user->getHostname().size(), user->getHostname().data(),
				channel.getUserPrefix(*user_pair.second) ? channel.getUserPrefix(*user_pair.second) : ' ',
				user_pair.second->getPrefixes().size(), user_pair.second->getPrefixes().data(),
				channel.getName().size(), channel.getName().data(),
				user->getChannelCount()), GenericCommand::DisplayType::PublicSuccess);
			line = line->next;
		};
	};

	return ret;
}